

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

optional<const_tinyusdz::PrimSpec_*> *
tinyusdz::anon_unknown_240::GetPrimSpecAtPathRec
          (optional<const_tinyusdz::PrimSpec_*> *__return_storage_ptr__,PrimSpec *parent,
          string *parent_path,Path *path,uint32_t depth)

{
  PrimSpec *pPVar1;
  __type _Var2;
  storage_t<const_tinyusdz::PrimSpec_*> *psVar3;
  PrimSpec *parent_00;
  string elementName;
  string abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((depth < 0x8000001) && (parent != (PrimSpec *)0x0)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_b0,(string *)(parent + 0x28));
    std::operator+(&local_50,parent_path,"/");
    std::operator+(&local_90,&local_50,&local_b0);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    Path::full_path_name_abi_cxx11_(&local_90,path);
    _Var2 = std::operator==(&local_70,&local_90);
    std::__cxx11::string::_M_dispose();
    if (_Var2) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::PrimSpec_*>)parent;
      std::__cxx11::string::_M_dispose();
    }
    else {
      std::__cxx11::string::_M_dispose();
      pPVar1 = *(PrimSpec **)(parent + 0x50);
      for (parent_00 = *(PrimSpec **)(parent + 0x48); parent_00 != pPVar1;
          parent_00 = parent_00 + 0x568) {
        GetPrimSpecAtPathRec
                  ((optional<const_tinyusdz::PrimSpec_*> *)&local_90,parent_00,&local_70,path,
                   depth + 1);
        local_b0._M_dataplus._M_p._0_1_ = (char)local_90._M_dataplus._M_p;
        if ((char)local_90._M_dataplus._M_p == '\x01') {
          local_b0._M_string_length = local_90._M_string_length;
          psVar3 = (storage_t<const_tinyusdz::PrimSpec_*> *)
                   nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::value
                             ((optional<const_tinyusdz::PrimSpec_*> *)&local_b0);
          __return_storage_ptr__->has_value_ = true;
          __return_storage_ptr__->contained = *psVar3;
          goto LAB_001390f0;
        }
      }
      __return_storage_ptr__->has_value_ = false;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::PrimSpec_*>)0x0;
    }
LAB_001390f0:
    std::__cxx11::string::_M_dispose();
  }
  else {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<const_tinyusdz::PrimSpec_*>)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<const PrimSpec *> GetPrimSpecAtPathRec(
    const PrimSpec *parent, const std::string &parent_path, const Path &path,
    uint32_t depth) {
  if (depth > (1024 * 1024 * 128)) {
    // Too deep.
    return nonstd::nullopt;
  }

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  {
    std::string elementName = parent->name();

    abs_path = parent_path + "/" + elementName;

    if (abs_path == path.full_path_name()) {
      return parent;
    }
  }

  for (const auto &child : parent->children()) {
    if (auto pv = GetPrimSpecAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  // not found
  return nonstd::nullopt;
}